

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O0

void __thiscall Rml::Property::Property(Property *this)

{
  Property *this_local;
  
  Variant::Variant(&this->value);
  this->unit = UNKNOWN;
  this->specificity = -1;
  this->definition = (PropertyDefinition *)0x0;
  this->parser_index = -1;
  ::std::shared_ptr<const_Rml::PropertySource>::shared_ptr(&this->source);
  this->definition = (PropertyDefinition *)0x0;
  this->parser_index = -1;
  return;
}

Assistant:

Property::Property() : unit(Unit::UNKNOWN), specificity(-1)
{
	definition = nullptr;
	parser_index = -1;
}